

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteVarInt<HashWriter,(VarIntMode)0,unsigned_int>(HashWriter *os,uint n)

{
  ulong uVar1;
  long in_FS_OFFSET;
  bool bVar2;
  uchar tmp [5];
  byte local_26;
  byte local_25 [5];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_25[0] = (byte)n & 0x7f;
  if (n < 0x80) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      n = (n >> 7) - 1;
      local_25[uVar1 + 1] = (byte)n | 0x80;
      uVar1 = uVar1 + 1;
    } while (0x7f < n);
    uVar1 = uVar1 & 0xffffffff;
  }
  do {
    local_26 = local_25[uVar1];
    CSHA256::Write(&os->ctx,&local_26,1);
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}